

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O0

MatrixXd * __thiscall
CppMLNN::normalize_examples(MatrixXd *__return_storage_ptr__,CppMLNN *this,MatrixXd *examples)

{
  ostream *this_00;
  double local_50;
  type local_48;
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_20;
  MatrixXd *examples_local;
  CppMLNN *this_local;
  
  local_20 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)examples;
  examples_local = (MatrixXd *)this;
  this_local = (CppMLNN *)__return_storage_ptr__;
  this_00 = std::operator<<((ostream *)&std::cout,"normalize_examples");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_50 = 255.0;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator/(&local_48,local_20,&local_50);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)__return_storage_ptr__,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd CppMLNN::normalize_examples(const MatrixXd& examples) {
	cout << __FUNCTION__ << endl;
	return examples / 255.0;
}